

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.h
# Opt level: O2

bool el::base::utils::Utils::
     installCallback<el::base::DefaultLogDispatchCallback,std::shared_ptr<el::LogDispatchCallback>>
               (string *id,
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>_>
               *mapT)

{
  iterator iVar1;
  DefaultLogDispatchCallback *__p;
  __shared_ptr<el::LogDispatchCallback,(__gnu_cxx::_Lock_policy)2> local_60 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
  local_50;
  
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&mapT->_M_h,id);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    __p = (DefaultLogDispatchCallback *)operator_new(0x58);
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)0x0;
    *(undefined8 *)
     &(__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
      field_0x8 = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_buckets = (__buckets_ptr)0x0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_bucket_count = 0;
    *(undefined8 *)&(__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
    *(undefined8 *)&(__p->super_LogDispatchCallback).field_0x48 = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_before_begin._M_nxt =
         (_Hash_node_base *)0x0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_element_count = 0;
    __p->m_data = (LogDispatchData *)0x0;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.field_0x9
         = 1;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_buckets =
         &(__p->super_LogDispatchCallback).m_fileLocks._M_h._M_single_bucket;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_bucket_count = 1;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_rehash_policy._M_next_resize = 0;
    (__p->super_LogDispatchCallback).m_fileLocks._M_h._M_single_bucket = (__node_base_ptr)0x0;
    (__p->super_LogDispatchCallback).super_Callback<el::LogDispatchData>.super_ThreadSafe.
    _vptr_ThreadSafe = (_func_int **)&PTR_acquireLock_0012c3f0;
    ::std::__shared_ptr<el::LogDispatchCallback,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<el::base::DefaultLogDispatchCallback,void>(local_60,__p);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
    ::pair<std::shared_ptr<el::LogDispatchCallback>,_true>
              (&local_50,id,(shared_ptr<el::LogDispatchCallback> *)local_60);
    ::std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::_M_emplace<std::pair<std::__cxx11::string,std::shared_ptr<el::LogDispatchCallback>>>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<el::LogDispatchCallback>>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)mapT,&local_50);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>
    ::~pair(&local_50);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  }
  return iVar1.
         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<el::LogDispatchCallback>_>,_true>
         ._M_cur == (__node_type *)0x0;
}

Assistant:

static bool installCallback(const std::string& id, std::unordered_map<std::string, TPtr>* mapT) {
    if (mapT->find(id) == mapT->end()) {
      mapT->insert(std::make_pair(id, TPtr(new T())));
      return true;
    }
    return false;
  }